

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O1

void __thiscall V2ModDel::renderChan(V2ModDel *this,StereoSample *chanbuf,int nsamples)

{
  float fVar1;
  float *pfVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  if (((this->wetout != 0.0) || (NAN(this->wetout))) && (0 < nsamples)) {
    fVar1 = this->dryout;
    uVar3 = 0;
    do {
      fVar8 = chanbuf[uVar3].field_0.l + 3.8146973e-06;
      fVar7 = *(float *)((long)chanbuf + uVar3 * 8 + 4);
      uVar5 = (ulong)this->mmaxoffs * (ulong)((int)this->mcnt >> 0x1f ^ this->mcnt * 2);
      uVar6 = this->dbptr - ((int)(uVar5 >> 0x20) + this->dboffs[0]);
      pfVar2 = this->db[0];
      fVar9 = (pfVar2[uVar6 - 1 & this->dbufmask] - pfVar2[uVar6 & this->dbufmask]) *
              ((float)((uint)(uVar5 >> 9) & 0x7fffff | 0x3f800000) + -1.0) +
              pfVar2[uVar6 & this->dbufmask];
      pfVar2[this->dbptr] = this->fbval * fVar9 + fVar8;
      fVar7 = fVar7 + 3.8146973e-06;
      chanbuf[uVar3].field_0.l = fVar8 * fVar1 + fVar9 * this->wetout;
      iVar4 = this->mphase + this->mcnt;
      uVar5 = (ulong)this->mmaxoffs * (ulong)(uint)(iVar4 >> 0x1f ^ iVar4 * 2);
      uVar6 = this->dbptr - ((int)(uVar5 >> 0x20) + this->dboffs[1]);
      pfVar2 = this->db[1];
      fVar8 = (pfVar2[uVar6 - 1 & this->dbufmask] - pfVar2[uVar6 & this->dbufmask]) *
              ((float)((uint)(uVar5 >> 9) & 0x7fffff | 0x3f800000) + -1.0) +
              pfVar2[uVar6 & this->dbufmask];
      pfVar2[this->dbptr] = this->fbval * fVar8 + fVar7;
      *(float *)((long)chanbuf + uVar3 * 8 + 4) = fVar7 * fVar1 + fVar8 * this->wetout;
      this->mcnt = this->mcnt + this->mfreq;
      this->dbptr = this->dbptr + 1 & this->dbufmask;
      uVar3 = uVar3 + 1;
    } while ((uint)nsamples != uVar3);
  }
  return;
}

Assistant:

void renderChan(StereoSample *chanbuf, int nsamples)
    {
        if (!wetout)
            return;

        COVER("MODDEL chan");

        float dry = dryout;
        for (int i=0; i < nsamples; i++)
            processSample(&chanbuf[i], chanbuf[i].l + fcdcoffset, chanbuf[i].r + fcdcoffset, dry);
    }